

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O2

void __thiscall RTree_node::~RTree_node(RTree_node *this)

{
  Polygon *pPVar1;
  pointer pdVar2;
  RTree_node *this_00;
  pointer pdVar3;
  int i_1;
  long lVar4;
  int i;
  long lVar5;
  
  if (this->is_leaf == false) {
    lVar5 = 0;
    for (lVar4 = 0; lVar4 < this->elements; lVar4 = lVar4 + 1) {
      this_00 = *(RTree_node **)
                 ((long)&((this->data_internal_node).
                          super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>.
                          _M_impl.super__Vector_impl_data._M_start)->child + lVar5);
      if (this_00 != (RTree_node *)0x0) {
        ~RTree_node(this_00);
      }
      operator_delete(this_00,0x48);
      pdVar3 = (this->data_internal_node).
               super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pdVar3->child + lVar5) = 0;
      pPVar1 = *(Polygon **)((long)&pdVar3->region + lVar5);
      if (pPVar1 != (Polygon *)0x0) {
        Polygon::~Polygon(pPVar1);
      }
      operator_delete(pPVar1,0x38);
      *(undefined8 *)
       ((long)&((this->data_internal_node).
                super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
                super__Vector_impl_data._M_start)->region + lVar5) = 0;
      lVar5 = lVar5 + 0x10;
    }
  }
  else {
    lVar4 = 0;
    for (lVar5 = 0; lVar5 < this->elements; lVar5 = lVar5 + 1) {
      pPVar1 = *(Polygon **)
                ((long)&((this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>.
                         _M_impl.super__Vector_impl_data._M_start)->polygon + lVar4);
      if (pPVar1 != (Polygon *)0x0) {
        Polygon::~Polygon(pPVar1);
        operator_delete(pPVar1,0x38);
        pdVar2 = (this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pdVar2->polygon + lVar4) = 0;
        pPVar1 = *(Polygon **)((long)&pdVar2->region + lVar4);
        if (pPVar1 != (Polygon *)0x0) {
          Polygon::~Polygon(pPVar1);
        }
        operator_delete(pPVar1,0x38);
        *(undefined8 *)
         ((long)&((this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                  super__Vector_impl_data._M_start)->region + lVar4) = 0;
      }
      lVar4 = lVar4 + 0x10;
    }
  }
  std::_Vector_base<d_internal_node,_std::allocator<d_internal_node>_>::~_Vector_base
            (&(this->data_internal_node).
              super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>);
  std::_Vector_base<d_leaf,_std::allocator<d_leaf>_>::~_Vector_base
            (&(this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>);
  return;
}

Assistant:

RTree_node::~RTree_node(){
    if(!this->is_leaf){
        for(int i = 0; i < this->elements; i++){
            delete this->data_internal_node[i].child;
            this->data_internal_node[i].child = nullptr;
            delete this->data_internal_node[i].region;
            this->data_internal_node[i].region = nullptr;
        }
    }
    else{
        for(int i = 0; i < this->elements; i++){
            if(this->data_leafs[i].polygon!=nullptr){
                delete this->data_leafs[i].polygon;
                this->data_leafs[i].polygon = nullptr;
                delete this->data_leafs[i].region;
                this->data_leafs[i].region = nullptr;
            }
        }
    }
}